

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction_job.tpl.h
# Opt level: O1

bool __thiscall
r_exec::ReductionJob<r_exec::AutoFocusController>::update
          (ReductionJob<r_exec::AutoFocusController> *this,uint64_t now)

{
  _Mem *this_00;
  
  this_00 = (_Mem *)r_code::Mem::Get();
  _Mem::register_reduction_job_latency(this_00,now - (this->super__ReductionJob).ijt);
  AutoFocusController::reduce
            ((AutoFocusController *)(this->processor).object,(View *)(this->input).object);
  return true;
}

Assistant:

bool ReductionJob<_P>::update(uint64_t now)
{
    _Mem::Get()->register_reduction_job_latency(now - ijt);
    processor->reduce(input);
    return true;
}